

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_kv_functional_test.cc
# Opt level: O2

int main(void)

{
  uint8_t opt;
  int iVar1;
  size_t chunksize;
  int iVar2;
  
  multi_kv_open_test();
  for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
    chunksize = (ulong)(iVar2 != 1) * 0x10 + 0x10;
    if (iVar2 == 0) {
      chunksize = 8;
    }
    printf("Chunk size: %d bytes\n",chunksize);
    for (iVar1 = 0; iVar1 != 2; iVar1 = iVar1 + 1) {
      opt = (uint8_t)iVar1;
      multi_kv_test(opt,chunksize);
      multi_kv_iterator_key_test(opt,chunksize);
      multi_kv_iterator_seq_test(opt,chunksize);
      multi_kv_txn_test(opt,chunksize);
      multi_kv_snapshot_test(opt,chunksize);
      multi_kv_rollback_test(opt,chunksize);
    }
  }
  multi_kv_custom_cmp_test();
  multi_kv_fdb_open_custom_cmp_test();
  multi_kv_use_existing_mode_test();
  multi_kv_close_test();
  return 0;
}

Assistant:

int main(){
    int i, j;
    uint8_t opt;
    size_t chunksize;

    multi_kv_open_test();
    for (j=0;j<3;++j) {
        if (j==0) {
            chunksize = 8;
        } else if (j==1) {
            chunksize = 16;
        } else {
            chunksize = 32;
        }
        printf("Chunk size: %d bytes\n", (int)chunksize);
        for (i=0;i<2;++i){
            opt = (i==0)?(0x0):(MULTI_KV_VAR_CMP);
            multi_kv_test(opt, chunksize);
            multi_kv_iterator_key_test(opt, chunksize);
            multi_kv_iterator_seq_test(opt, chunksize);
            multi_kv_txn_test(opt, chunksize);
            multi_kv_snapshot_test(opt, chunksize);
            multi_kv_rollback_test(opt, chunksize);
        }
    }
    multi_kv_custom_cmp_test();
    multi_kv_fdb_open_custom_cmp_test();
    multi_kv_use_existing_mode_test();
    multi_kv_close_test();

    return 0;
}